

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O1

bool __thiscall FxExpression::IsObject(FxExpression *this)

{
  PType *pPVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  undefined4 extraout_var_00;
  PClass *pPVar5;
  undefined4 extraout_var_01;
  bool bVar6;
  
  pPVar5 = PPointer::RegistrationInfo.MyClass;
  pPVar1 = this->ValueType;
  if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
    iVar3 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
    (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar2 = PClassPointer::RegistrationInfo.MyClass;
  pPVar4 = (pPVar1->super_PTypeBase).super_DObject.Class;
  bVar6 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar5 && bVar6) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar6 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar5) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (bVar6) {
    pPVar1 = this->ValueType;
    if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
      (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar3);
    }
    pPVar4 = PClass::RegistrationInfo.MyClass;
    pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
    bVar6 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar2 && bVar6) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar2) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if ((!bVar6) && ((PPointer *)this->ValueType != TypeNullPtr)) {
      pPVar1 = ((PPointer *)this->ValueType)->PointedType;
      if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
        iVar3 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
        (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar3);
      }
      pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
      if (pPVar5 == pPVar4 || pPVar5 == (PClass *)0x0) {
        return pPVar5 != (PClass *)0x0;
      }
      do {
        pPVar5 = pPVar5->ParentClass;
        if (pPVar5 == pPVar4) {
          return pPVar5 != (PClass *)0x0;
        }
      } while (pPVar5 != (PClass *)0x0);
      return pPVar5 != (PClass *)0x0;
    }
  }
  return false;
}

Assistant:

bool IsObject() const { return ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && !ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) && ValueType != TypeNullPtr && static_cast<PPointer*>(ValueType)->PointedType->IsKindOf(RUNTIME_CLASS(PClass)); }